

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::Parse(cmListFileParser *this)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  cmListFileContext *pcVar5;
  cmListFileContext local_488;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_418;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3e0 [8];
  optional<cmListFileContext> badNesting;
  ostringstream local_348 [8];
  ostringstream error_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream error;
  cmListFileLexer_Token *token;
  bool haveNewline;
  cmListFileParser *this_local;
  
  bVar1 = true;
LAB_0035abfe:
  do {
    do {
      pcVar2 = cmListFileLexer_Scan(this->Lexer);
      if (pcVar2 == (cmListFileLexer_Token *)0x0) {
        CheckNesting((optional<cmListFileContext> *)local_3e0,this);
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_3e0);
        if (bVar1) {
          this_00 = this->Messenger;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"Flow control statements are not properly nested.",
                     &local_401);
          pcVar5 = std::optional<cmListFileContext>::operator*
                             ((optional<cmListFileContext> *)local_3e0);
          cmListFileContext::cmListFileContext(&local_488,pcVar5);
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    (&local_418,(cmListFileContext *)&this->Backtrace);
          cmMessenger::IssueMessage
                    (this_00,FATAL_ERROR,&local_400,(cmListFileBacktrace *)&local_418);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_418);
          cmListFileContext::~cmListFileContext(&local_488);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
          cmSystemTools::SetFatalErrorOccurred();
          this_local._7_1_ = 0;
        }
        std::optional<cmListFileContext>::~optional((optional<cmListFileContext> *)local_3e0);
        if (!bVar1) {
          this_local._7_1_ = 1;
        }
LAB_0035b147:
        return (bool)(this_local._7_1_ & 1);
      }
    } while (pcVar2->type == cmListFileLexer_Token_Space);
    if (pcVar2->type == cmListFileLexer_Token_Newline) {
      bVar1 = true;
      goto LAB_0035abfe;
    }
    if (pcVar2->type != cmListFileLexer_Token_CommentBracket) {
      if (pcVar2->type != cmListFileLexer_Token_Identifier) {
        std::__cxx11::ostringstream::ostringstream(local_348);
        poVar3 = std::operator<<((ostream *)local_348,"Parse error.  Expected a command name, got ")
        ;
        pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3," with text \"");
        poVar3 = std::operator<<(poVar3,pcVar2->text);
        std::operator<<(poVar3,"\".");
        std::__cxx11::ostringstream::str();
        IssueError(this,(string *)
                        &badNesting.super__Optional_base<cmListFileContext,_false,_false>._M_payload
                         .super__Optional_payload<cmListFileContext,_true,_false,_false>.
                         super__Optional_payload_base<cmListFileContext>._M_engaged);
        std::__cxx11::string::~string
                  ((string *)
                   &badNesting.super__Optional_base<cmListFileContext,_false,_false>._M_payload.
                    super__Optional_payload<cmListFileContext,_true,_false,_false>.
                    super__Optional_payload_base<cmListFileContext>._M_engaged);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_348);
        goto LAB_0035b147;
      }
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar3 = std::operator<<((ostream *)local_1a0,"Parse error.  Expected a newline, got ");
        pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3," with text \"");
        poVar3 = std::operator<<(poVar3,pcVar2->text);
        std::operator<<(poVar3,"\".");
        std::__cxx11::ostringstream::str();
        IssueError(this,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
        goto LAB_0035b147;
      }
      bVar1 = ParseFunction(this,pcVar2->text,(long)pcVar2->line);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0035b147;
      }
      std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>::
      emplace_back<std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((vector<cmListFileFunction,std::allocator<cmListFileFunction>> *)this->ListFile,
                 &this->FunctionName,&this->FunctionLine,&this->FunctionLineEnd,
                 &this->FunctionArguments);
    }
    bVar1 = false;
  } while( true );
}

Assistant:

bool cmListFileParser::Parse()
{
  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.emplace_back(
            std::move(this->FunctionName), this->FunctionLine,
            this->FunctionLineEnd, std::move(this->FunctionArguments));
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  // Check if all functions are nested properly.
  if (auto badNesting = this->CheckNesting()) {
    this->Messenger->IssueMessage(
      MessageType::FATAL_ERROR,
      "Flow control statements are not properly nested.",
      this->Backtrace.Push(*badNesting));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}